

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxLPBase(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *old)

{
  long in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffffd0;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffff8;
  
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPRowSetBase(unaff_retaddr,in_stack_fffffffffffffff8);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)unaff_retaddr,
                 (LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffff8);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__SPxLPBase_008997c8;
  *(undefined ***)(in_RDI[3].data._M_elems + 8) = &PTR__SPxLPBase_00899a68;
  in_RDI[7].data._M_elems[2] = *(uint *)(in_RSI + 400);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffd0,in_RDI);
  *(byte *)(in_RDI[8].data._M_elems + 3) = *(byte *)(in_RSI + 0x1cc) & 1;
  *(undefined8 *)(in_RDI[8].data._M_elems + 4) = *(undefined8 *)(in_RSI + 0x1d0);
  *(undefined8 *)(in_RDI[8].data._M_elems + 6) = *(undefined8 *)(in_RSI + 0x1d8);
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x47104a);
  std::shared_ptr<soplex::Tolerances>::operator=
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffffd0,
             (shared_ptr<soplex::Tolerances> *)in_RDI);
  return;
}

Assistant:

SPxLPBase(const SPxLPBase<R>& old)
      : LPRowSetBase<R>(old)
      , LPColSetBase<R>(old)
      , thesense(old.thesense)
      , offset(old.offset)
      , _isScaled(old._isScaled)
      , lp_scaler(old.lp_scaler)
      , spxout(old.spxout)
   {
      _tolerances = old._tolerances;
      assert(isConsistent());
   }